

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O2

int AF_DSpotState_GetNextInList
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  ASpecialSpot *val;
  int iVar2;
  char *pcVar3;
  DSpotState *this;
  PClassActor *type;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004aeb6d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004aeb54:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004aeb6d:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x149,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DSpotState *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DSpotState *)0x0) goto LAB_004aeaac;
    bVar1 = DObject::IsKindOf((DObject *)this,DSpotState::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DSpotState))";
      goto LAB_004aeb6d;
    }
  }
  else {
    if (this != (DSpotState *)0x0) goto LAB_004aeb54;
LAB_004aeaac:
    this = (DSpotState *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_004aeb8c;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    type = (PClassActor *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (type != (PClassActor *)0x0) {
        bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
        if (!bVar1) {
          pcVar3 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_004aeb8c;
        }
        goto LAB_004aeafe;
      }
    }
    else if (type != (PClassActor *)0x0) goto LAB_004aeb5d;
    type = (PClassActor *)0x0;
LAB_004aeafe:
    if ((uint)numparam < 3) {
      pcVar3 = "(paramnum) < numparam";
    }
    else {
      if (param[2].field_0.field_3.Type == '\0') {
        val = DSpotState::GetNextInList(this,type,param[2].field_0.i);
        if (numret < 1) {
          iVar2 = 0;
        }
        else {
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                          ,0x14c,
                          "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          iVar2 = 1;
          VMReturn::SetPointer(ret,val,1);
        }
        return iVar2;
      }
      pcVar3 = "param[paramnum].Type == REGT_INT";
    }
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x14b,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
LAB_004aeb5d:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004aeb8c:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                ,0x14a,
                "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DSpotState, GetNextInList)
{
	PARAM_SELF_PROLOGUE(DSpotState);
	PARAM_CLASS(type, AActor);
	PARAM_INT(skipcounter);
	ACTION_RETURN_OBJECT(self->GetNextInList(type, skipcounter));
}